

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# broadcast.cpp
# Opt level: O1

void onClose(Ptr *ss)

{
  ClosureTask *this;
  uint uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  Ptr local_40;
  ClosureTask *local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  uVar1 = (*(((ss->super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            super_Task)._vptr_Task[4])();
  local_30 = (ClosureTask *)0x0;
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x48);
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001264f8;
  this = (ClosureTask *)(p_Var2 + 1);
  local_68._8_8_ = 0;
  local_68._M_unused._0_8_ = (undefined8)(ulong)uVar1;
  pcStack_50 = std::
               _Function_handler<void_(),_std::_Bind<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/sniperHW[P]hwnet/test/broadcast.cpp:152:25)_()>_>
               ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(),_std::_Bind<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/sniperHW[P]hwnet/test/broadcast.cpp:152:25)_()>_>
             ::_M_manager;
  hwnet::ClosureTask::ClosureTask(this,(Callback *)&local_68);
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  local_30 = this;
  _Stack_28._M_pi = p_Var2;
  if ((p_Var2[2]._vptr__Sp_counted_base == (_func_int **)0x0) ||
     (*(int *)(p_Var2[2]._vptr__Sp_counted_base + 1) == 0)) {
    *(ClosureTask **)&p_Var2[1]._M_use_count = this;
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(p_Var2 + 2),&_Stack_28);
  }
  local_40.super___shared_ptr<hwnet::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_30->super_Task;
  local_40.super___shared_ptr<hwnet::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_28._M_pi;
  local_30 = (ClosureTask *)0x0;
  _Stack_28._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  hwnet::ThreadPool::TaskQueue::PostTask(&mainThread.queue_,&local_40);
  if (local_40.super___shared_ptr<hwnet::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<hwnet::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (_Stack_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_28._M_pi);
  }
  puts("onClose");
  return;
}

Assistant:

void onClose(const TCPSocket::Ptr &ss) {
	auto fd = ss->Fd();
	mainThread.PostClosure([fd](){
		for(size_t i = 0 ; i < clients.size(); i++) {
			if(clients[i]->Fd() == fd) {
				clientcount--;
				swap(clients[i],clients[clients.size()-1]);
				clients.pop_back();
				if(clientcount == 0){
					poller_.Stop();
				}
			}
		}		
	});  
	printf("onClose\n");
}